

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O2

string * __thiscall
om::net::ip4_addr::to_string_abi_cxx11_(string *__return_storage_ptr__,ip4_addr *this)

{
  ostream *poVar1;
  stringstream ss;
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::operator<<(poVar1,'.');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::operator<<(poVar1,'.');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::operator<<(poVar1,'.');
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const
			{
				std::stringstream ss;
				ss << (_addr >> 0  & 0x000000ff) << '.';
				ss << (_addr >> 8  & 0x000000ff) << '.';
				ss << (_addr >> 16 & 0x000000ff) << '.';
				ss << (_addr >> 24 & 0x000000ff);
				return ss.str();
			}